

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20250127::container_internal::map_slot_policy<long,long>::
     construct<std::allocator<std::pair<long_const,long>>,std::piecewise_construct_t_const&,std::tuple<long_const&>,std::tuple<>>
               (allocator<std::pair<const_long,_long>_> *alloc,slot_type *slot,
               piecewise_construct_t *args,tuple<const_long_&> *args_1,tuple<> *args_2)

{
  tuple<> *args_local_2;
  tuple<const_long_&> *args_local_1;
  piecewise_construct_t *args_local;
  slot_type *slot_local;
  allocator<std::pair<const_long,_long>_> *alloc_local;
  
  map_slot_policy<long,_long>::emplace(slot);
  std::allocator_traits<std::allocator<std::pair<long_const,long>>>::
  construct<std::pair<long,long>,std::piecewise_construct_t_const&,std::tuple<long_const&>,std::tuple<>>
            (alloc,(pair<long,_long> *)&slot->value,args,args_1,args_2);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                   std::forward<Args>(args)...);
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::forward<Args>(args)...);
    }
  }